

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall
QTreeViewPrivate::calcLogicalIndices
          (QTreeViewPrivate *this,QList<int> *logicalIndices,
          QList<QStyleOptionViewItem::ViewItemPosition> *itemPositions,int left,int right)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int logicalIndex;
  int iVar5;
  pointer pVVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int visualIndex;
  ulong uVar10;
  ulong uVar11;
  ViewItemPosition VVar12;
  long in_FS_OFFSET;
  int local_64;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = QHeaderView::count(this->header);
  iVar8 = left;
  do {
    logicalIndex = -1;
    if (iVar8 < 1) break;
    iVar8 = iVar8 + -1;
    logicalIndex = QHeaderView::logicalIndex(this->header,iVar8);
    bVar3 = QHeaderView::isSectionHidden(this->header,logicalIndex);
  } while (bVar3);
  local_64 = -1;
  if (left < iVar4) {
    local_64 = -1;
    do {
      iVar8 = QHeaderView::logicalIndex(this->header,left);
      bVar3 = QHeaderView::isSectionHidden(this->header,iVar8);
      if (bVar3) {
LAB_005ad185:
        bVar3 = false;
        iVar8 = local_64;
      }
      else {
        bVar3 = true;
        if (left <= right) {
          local_3c = iVar8;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)logicalIndices,(logicalIndices->d).size,&local_3c);
          QList<int>::end(logicalIndices);
          goto LAB_005ad185;
        }
      }
      local_64 = iVar8;
    } while ((!bVar3) && (bVar3 = iVar4 + -1 != left, left = left + 1, bVar3));
  }
  QList<QStyleOptionViewItem::ViewItemPosition>::resize(itemPositions,(logicalIndices->d).size);
  uVar7 = (logicalIndices->d).size;
  if (uVar7 != 0) {
    uVar10 = 0;
    do {
      piVar2 = (logicalIndices->d).ptr;
      uVar11 = uVar10 + 1;
      iVar8 = local_64;
      if (uVar11 < uVar7) {
        iVar8 = piVar2[uVar10 + 1];
      }
      iVar9 = logicalIndex;
      if (uVar10 != 0) {
        iVar9 = piVar2[uVar10 - 1];
      }
      VVar12 = OnlyOne;
      if ((((iVar4 != 1) && ((iVar1 = piVar2[uVar10], iVar8 != 0 || (iVar9 != -1)))) &&
          ((iVar1 != 0 || (iVar8 != -1)))) && (this->spanning == false)) {
        iVar5 = this->treePosition;
        if (iVar5 < 0) {
          iVar5 = QHeaderView::logicalIndex(this->header,0);
        }
        VVar12 = Beginning;
        if ((iVar5 != iVar1) && (iVar8 == 0 || iVar9 != -1)) {
          VVar12 = (iVar8 + 1U < 2) + Middle;
        }
      }
      pVVar6 = QList<QStyleOptionViewItem::ViewItemPosition>::data(itemPositions);
      pVVar6[uVar10] = VVar12;
      uVar7 = (logicalIndices->d).size;
      uVar10 = uVar11;
    } while (uVar11 < uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::calcLogicalIndices(
        QList<int> *logicalIndices, QList<QStyleOptionViewItem::ViewItemPosition> *itemPositions,
        int left, int right) const
{
    const int columnCount = header->count();
    /* 'left' and 'right' are the left-most and right-most visible visual indices.
       Compute the first visible logical indices before and after the left and right.
       We will use these values to determine the QStyleOptionViewItem::viewItemPosition. */
    int logicalIndexBeforeLeft = -1, logicalIndexAfterRight = -1;
    for (int visualIndex = left - 1; visualIndex >= 0; --visualIndex) {
        int logicalIndex = header->logicalIndex(visualIndex);
        if (!header->isSectionHidden(logicalIndex)) {
            logicalIndexBeforeLeft = logicalIndex;
            break;
        }
    }

    for (int visualIndex = left; visualIndex < columnCount; ++visualIndex) {
        int logicalIndex = header->logicalIndex(visualIndex);
        if (!header->isSectionHidden(logicalIndex)) {
            if (visualIndex > right) {
                logicalIndexAfterRight = logicalIndex;
                break;
            }
            logicalIndices->append(logicalIndex);
        }
    }

    itemPositions->resize(logicalIndices->size());
    for (int currentLogicalSection = 0; currentLogicalSection < logicalIndices->size(); ++currentLogicalSection) {
        const int headerSection = logicalIndices->at(currentLogicalSection);
        // determine the viewItemPosition depending on the position of column 0
        int nextLogicalSection = currentLogicalSection + 1 >= logicalIndices->size()
                                 ? logicalIndexAfterRight
                                 : logicalIndices->at(currentLogicalSection + 1);
        int prevLogicalSection = currentLogicalSection - 1 < 0
                                 ? logicalIndexBeforeLeft
                                 : logicalIndices->at(currentLogicalSection - 1);
        QStyleOptionViewItem::ViewItemPosition pos;
        if (columnCount == 1 || (nextLogicalSection == 0 && prevLogicalSection == -1)
            || (headerSection == 0 && nextLogicalSection == -1) || spanning)
            pos = QStyleOptionViewItem::OnlyOne;
        else if (isTreePosition(headerSection) || (nextLogicalSection != 0 && prevLogicalSection == -1))
            pos = QStyleOptionViewItem::Beginning;
        else if (nextLogicalSection == 0 || nextLogicalSection == -1)
            pos = QStyleOptionViewItem::End;
        else
            pos = QStyleOptionViewItem::Middle;
        (*itemPositions)[currentLogicalSection] = pos;
    }
}